

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int get_closure_var2(JSContext *ctx,JSFunctionDef *s,JSFunctionDef *fd,BOOL is_local,BOOL is_arg,
                    int var_idx,JSAtom var_name,BOOL is_const,BOOL is_lexical,JSVarKindEnum var_kind
                    )

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (s->parent != fd) {
    var_idx = get_closure_var2(ctx,s->parent,fd,is_local,is_arg,var_idx,var_name,is_const,is_lexical
                               ,var_kind);
    if (var_idx < 0) {
      uVar3 = 0xffffffffffffffff;
      goto LAB_0014f77d;
    }
    is_local = 0;
  }
  uVar3 = 0;
  uVar4 = (ulong)(uint)s->closure_var_count;
  if (s->closure_var_count < 1) {
    uVar4 = uVar3;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      iVar2 = add_closure_var(ctx,s,is_local,is_arg,var_idx,var_name,is_const,is_lexical,var_kind);
      return iVar2;
    }
    if (((var_idx == (uint)s->closure_var[uVar3].var_idx) &&
        (bVar1 = *(byte *)(s->closure_var + uVar3), (bVar1 >> 1 & 1) == is_arg)) &&
       (is_local == (bVar1 & 1))) break;
    uVar3 = uVar3 + 1;
  }
LAB_0014f77d:
  return (int)uVar3;
}

Assistant:

static int get_closure_var2(JSContext *ctx, JSFunctionDef *s,
                            JSFunctionDef *fd, BOOL is_local,
                            BOOL is_arg, int var_idx, JSAtom var_name,
                            BOOL is_const, BOOL is_lexical,
                            JSVarKindEnum var_kind)
{
    int i;

    if (fd != s->parent) {
        var_idx = get_closure_var2(ctx, s->parent, fd, is_local,
                                   is_arg, var_idx, var_name,
                                   is_const, is_lexical, var_kind);
        if (var_idx < 0)
            return -1;
        is_local = FALSE;
    }
    for(i = 0; i < s->closure_var_count; i++) {
        JSClosureVar *cv = &s->closure_var[i];
        if (cv->var_idx == var_idx && cv->is_arg == is_arg &&
            cv->is_local == is_local)
            return i;
    }
    return add_closure_var(ctx, s, is_local, is_arg, var_idx, var_name,
                           is_const, is_lexical, var_kind);
}